

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_str_insert_at_rune(nk_str *str,int pos,char *cstr,int len)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  nk_rune unicode;
  int glyph_len;
  nk_rune local_20;
  int local_1c;
  
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x209a,"int nk_str_insert_at_rune(struct nk_str *, int, const char *, int)");
  }
  if (cstr != (char *)0x0) {
    if (len != 0) {
      pcVar2 = nk_str_at_rune(str,pos,&local_20,&local_1c);
      if (str->len == 0) {
        iVar1 = nk_str_append_text_char(str,cstr,len);
      }
      else {
        iVar1 = 0;
        if ((str->buffer).allocated == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = (int)(str->buffer).memory.ptr;
        }
        if (pcVar2 != (char *)0x0) {
          iVar1 = nk_str_insert_at_char(str,(int)pcVar2 - iVar3,cstr,len);
        }
      }
      return iVar1;
    }
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x209c,"int nk_str_insert_at_rune(struct nk_str *, int, const char *, int)");
  }
  __assert_fail("cstr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x209b,"int nk_str_insert_at_rune(struct nk_str *, int, const char *, int)");
}

Assistant:

NK_API int
nk_str_insert_at_rune(struct nk_str *str, int pos, const char *cstr, int len)
{
    int glyph_len;
    nk_rune unicode;
    const char *begin;
    const char *buffer;

    NK_ASSERT(str);
    NK_ASSERT(cstr);
    NK_ASSERT(len);
    if (!str || !cstr || !len) return 0;
    begin = nk_str_at_rune(str, pos, &unicode, &glyph_len);
    if (!str->len)
        return nk_str_append_text_char(str, cstr, len);
    buffer = nk_str_get_const(str);
    if (!begin) return 0;
    return nk_str_insert_at_char(str, (int)(begin - buffer), cstr, len);
}